

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# displ.cpp
# Opt level: O0

void __thiscall displ::drawParticles(displ *this,vector<particle,_std::allocator<particle>_> *p)

{
  float fVar1;
  bool bVar2;
  floatingType *pfVar3;
  Vector2f *pVVar4;
  ulong uVar5;
  Vector2u this_00;
  RenderStates *states;
  vec2f *pvVar6;
  undefined8 in_RSI;
  long in_RDI;
  float fVar7;
  floatingType fVar8;
  FloatRect FVar9;
  particle *i_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<particle,_std::allocator<particle>_> *__range2_1;
  int temperature_1;
  Vertex point;
  particle *i;
  const_iterator __end2;
  const_iterator __begin2;
  vector<particle,_std::allocator<particle>_> *__range2;
  FloatRect viewBoundingBox;
  int temperature;
  float vertices;
  CircleShape circle;
  float doubledZoom;
  RectangleShape rectangle;
  RenderWindow *in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffaa0;
  float in_stack_fffffffffffffaa4;
  Rect<float> *in_stack_fffffffffffffaa8;
  RectangleShape *in_stack_fffffffffffffab0;
  undefined8 in_stack_fffffffffffffab8;
  float fVar10;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  int in_stack_fffffffffffffad0;
  floatingType in_stack_fffffffffffffad4;
  undefined7 in_stack_fffffffffffffae0;
  undefined1 in_stack_fffffffffffffae7;
  undefined1 in_stack_fffffffffffffae8 [16];
  undefined1 in_stack_fffffffffffffaf8 [16];
  RenderStates *in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  float fVar11;
  RenderTarget *in_stack_fffffffffffffb80;
  Color local_41c;
  Vector2<float> local_418;
  reference local_410;
  particle *local_408;
  __normal_iterator<const_particle_*,_std::vector<particle,_std::allocator<particle>_>_> local_400;
  undefined8 local_3f8;
  int local_3ec;
  Vector2<float> local_3e8;
  Color local_3e0;
  Color local_3d4;
  undefined8 local_3d0;
  undefined8 local_3c8;
  reference local_3c0;
  particle *local_3b8;
  __normal_iterator<const_particle_*,_std::vector<particle,_std::allocator<particle>_>_> local_3b0;
  undefined8 local_3a8;
  Vector2<float> local_3a0;
  Vector2<float> local_398;
  Rect<float> local_390;
  int local_380;
  float local_37c;
  Transformable local_370 [2];
  Vector2u local_1d8;
  Vector2u local_1d0;
  float local_1c8;
  Vector2<float> local_1b8;
  Vector2<float> local_1b0 [52];
  undefined8 local_10;
  
  fVar10 = (float)((ulong)in_stack_fffffffffffffab8 >> 0x20);
  local_10 = in_RSI;
  sf::RenderTarget::clear
            ((RenderTarget *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
             (Color *)in_stack_fffffffffffffa98);
  sf::Vector2<float>::Vector2(local_1b0,0.0,0.0);
  sf::RectangleShape::RectangleShape
            (in_stack_fffffffffffffab0,(Vector2f *)in_stack_fffffffffffffaa8);
  pfVar3 = vec2<float>::getX((vec2<float> *)(in_RDI + 0x2c4));
  fVar7 = *pfVar3;
  pfVar3 = vec2<float>::getY((vec2<float> *)(in_RDI + 0x2c4));
  sf::Vector2<float>::Vector2(&local_1b8,fVar7,*pfVar3);
  sf::RectangleShape::setSize
            ((RectangleShape *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
             (Vector2f *)in_stack_fffffffffffffa98);
  sf::Shape::setOutlineColor
            (&in_stack_fffffffffffffab0->super_Shape,(Color *)in_stack_fffffffffffffaa8);
  sf::Shape::setFillColor
            (&in_stack_fffffffffffffab0->super_Shape,(Color *)in_stack_fffffffffffffaa8);
  vec2<float>::getX((vec2<float> *)(in_RDI + 0x2c4));
  sf::Shape::setOutlineThickness
            ((Shape *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
             (float)((ulong)in_stack_fffffffffffffa98 >> 0x20));
  sf::RenderTarget::draw
            (in_stack_fffffffffffffb80,
             (Drawable *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
             in_stack_fffffffffffffb70);
  pVVar4 = sf::View::getSize((View *)(in_RDI + 0x218));
  fVar7 = pVVar4->x;
  local_1d0 = sf::RenderWindow::getSize(in_stack_fffffffffffffa98);
  uVar5 = (ulong)local_1d0 & 0xffffffff;
  pVVar4 = sf::View::getSize((View *)(in_RDI + 0x218));
  fVar11 = pVVar4->y;
  this_00 = sf::RenderWindow::getSize(in_stack_fffffffffffffa98);
  local_1c8 = fVar7 / (float)uVar5 + fVar11 / (float)((ulong)this_00 >> 0x20);
  local_1d8 = this_00;
  if ((*(float *)(in_RDI + 0x2c0) / local_1c8) * 1.5 <= 1.0) {
    sf::Vertex::Vertex((Vertex *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
    local_3f8 = local_10;
    local_400._M_current =
         (particle *)
         std::vector<particle,_std::allocator<particle>_>::begin
                   ((vector<particle,_std::allocator<particle>_> *)in_stack_fffffffffffffa98);
    local_408 = (particle *)
                std::vector<particle,_std::allocator<particle>_>::end
                          ((vector<particle,_std::allocator<particle>_> *)in_stack_fffffffffffffa98)
    ;
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_particle_*,_std::vector<particle,_std::allocator<particle>_>_>
                               *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                              (__normal_iterator<const_particle_*,_std::vector<particle,_std::allocator<particle>_>_>
                               *)in_stack_fffffffffffffa98), bVar2) {
      local_410 = __gnu_cxx::
                  __normal_iterator<const_particle_*,_std::vector<particle,_std::allocator<particle>_>_>
                  ::operator*(&local_400);
      pvVar6 = particle::getVelocity(local_410);
      fVar8 = vec2<float>::getSquaredLength(pvVar6);
      local_3ec = (int)(fVar8 * 1020.0);
      if (0xfe < local_3ec) {
        local_3ec = 0xff;
      }
      pvVar6 = particle::getPosition(local_410);
      pfVar3 = vec2<float>::getX(pvVar6);
      in_stack_fffffffffffffaa4 = *pfVar3 - *(float *)(in_RDI + 0x2c0);
      pvVar6 = particle::getPosition(local_410);
      in_stack_fffffffffffffa98 = (RenderWindow *)vec2<float>::getY(pvVar6);
      sf::Vector2<float>::Vector2
                (&local_418,in_stack_fffffffffffffaa4,
                 *(float *)&(in_stack_fffffffffffffa98->super_Window).super_WindowBase.
                            _vptr_WindowBase - *(float *)(in_RDI + 0x2c0));
      local_3e8 = local_418;
      sf::Color::Color(&local_41c,(Uint8)local_3ec,'\0',0xff - (Uint8)local_3ec,0xff);
      local_3e0 = local_41c;
      sf::RenderTarget::draw
                (in_stack_fffffffffffffaf8._8_8_,in_stack_fffffffffffffaf8._0_8_,
                 in_stack_fffffffffffffae8._8_8_,in_stack_fffffffffffffae8._4_4_,
                 (RenderStates *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
      __gnu_cxx::
      __normal_iterator<const_particle_*,_std::vector<particle,_std::allocator<particle>_>_>::
      operator++(&local_400);
    }
  }
  else {
    sf::CircleShape::CircleShape
              ((CircleShape *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),fVar10,
               (size_t)in_stack_fffffffffffffab0);
    fVar7 = 0.4 / local_1c8 + 3.0;
    if (20.0 <= fVar7) {
      fVar7 = 20.0;
    }
    local_37c = fVar7;
    sf::CircleShape::setPointCount
              ((CircleShape *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
               (size_t)in_stack_fffffffffffffa98);
    sf::CircleShape::setRadius
              ((CircleShape *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
               (float)((ulong)in_stack_fffffffffffffa98 >> 0x20));
    states = (RenderStates *)sf::View::getCenter((View *)(in_RDI + 0x218));
    sf::View::getSize((View *)(in_RDI + 0x218));
    local_3a0 = sf::operator/((Vector2<float> *)in_stack_fffffffffffffa98,0.0);
    local_398 = sf::operator-((Vector2<float> *)in_stack_fffffffffffffa98,(Vector2<float> *)0x1256b2
                             );
    pVVar4 = sf::View::getSize((View *)(in_RDI + 0x218));
    sf::Rect<float>::Rect(&local_390,&local_398,pVVar4);
    local_3a8 = local_10;
    local_3b0._M_current =
         (particle *)
         std::vector<particle,_std::allocator<particle>_>::begin
                   ((vector<particle,_std::allocator<particle>_> *)in_stack_fffffffffffffa98);
    local_3b8 = (particle *)
                std::vector<particle,_std::allocator<particle>_>::end
                          ((vector<particle,_std::allocator<particle>_> *)in_stack_fffffffffffffa98)
    ;
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_particle_*,_std::vector<particle,_std::allocator<particle>_>_>
                               *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                              (__normal_iterator<const_particle_*,_std::vector<particle,_std::allocator<particle>_>_>
                               *)in_stack_fffffffffffffa98), bVar2) {
      local_3c0 = __gnu_cxx::
                  __normal_iterator<const_particle_*,_std::vector<particle,_std::allocator<particle>_>_>
                  ::operator*(&local_3b0);
      pvVar6 = particle::getPosition(local_3c0);
      pfVar3 = vec2<float>::getX(pvVar6);
      fVar10 = *pfVar3;
      fVar1 = *(float *)(in_RDI + 0x2c0);
      pvVar6 = particle::getPosition(local_3c0);
      pfVar3 = vec2<float>::getY(pvVar6);
      sf::Transformable::setPosition(local_370,fVar10 - fVar1,*pfVar3 - *(float *)(in_RDI + 0x2c0));
      FVar9 = sf::Shape::getGlobalBounds(&in_stack_fffffffffffffab0->super_Shape);
      local_3c8 = FVar9._8_8_;
      local_3d0 = FVar9._0_8_;
      bVar2 = sf::Rect<float>::intersects
                        ((Rect<float> *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        pvVar6 = particle::getVelocity(local_3c0);
        in_stack_fffffffffffffad4 = vec2<float>::getSquaredLength(pvVar6);
        in_stack_fffffffffffffad0 = (int)(in_stack_fffffffffffffad4 * 1020.0);
        if (0xfe < in_stack_fffffffffffffad0) {
          in_stack_fffffffffffffad0 = 0xff;
        }
        local_380 = in_stack_fffffffffffffad0;
        sf::Color::Color(&local_3d4,(Uint8)in_stack_fffffffffffffad0,'\0',
                         0xff - (Uint8)in_stack_fffffffffffffad0,0xff);
        sf::Shape::setFillColor
                  (&in_stack_fffffffffffffab0->super_Shape,(Color *)in_stack_fffffffffffffaa8);
        sf::RenderTarget::draw((RenderTarget *)this_00,(Drawable *)CONCAT44(fVar11,fVar7),states);
      }
      __gnu_cxx::
      __normal_iterator<const_particle_*,_std::vector<particle,_std::allocator<particle>_>_>::
      operator++(&local_3b0);
    }
    sf::CircleShape::~CircleShape((CircleShape *)0x1259d4);
  }
  sf::Window::display((Window *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
  sf::RectangleShape::~RectangleShape((RectangleShape *)0x125c07);
  return;
}

Assistant:

void displ::drawParticles(const std::vector<particle>& p)const
{
	window.clear(sf::Color::Black);

	sf::RectangleShape rectangle;
	rectangle.setSize(sf::Vector2f(box.getX(), box.getY()));
	rectangle.setOutlineColor(sf::Color::White);
	rectangle.setFillColor(sf::Color::Transparent);
	rectangle.setOutlineThickness(box.getX() / 100.f);
	window.draw(rectangle);

	float doubledZoom = view.getSize().x/(float)window.getSize().x + view.getSize().y/(float)window.getSize().y;

	if (radius/doubledZoom*1.5f > 1.f)
	{
		//Kółka są widoczne

		sf::CircleShape circle(radius);

		//Dokładność kształtów rośnie z powiększaniem
		float vertices = 0.4f/doubledZoom + 3.f;
		vertices = vertices < 20.f ? vertices : 20.f;
		circle.setPointCount((int)vertices);

		circle.setRadius(radius);
		int temperature;
		sf::FloatRect viewBoundingBox(view.getCenter() - view.getSize()/2.f, view.getSize());
		for(const auto& i : p)
		{
			circle.setPosition(i.getPosition().getX() - radius, i.getPosition().getY() - radius);

			//Poza ekranem nie rysujemy
			if (!viewBoundingBox.intersects(circle.getGlobalBounds()))
				continue;

			temperature = i.getVelocity().getSquaredLength() * 1020.f; // * 255.f / 0.25f;
			temperature = temperature < 255 ? temperature : 255;
			circle.setFillColor(sf::Color(temperature, 0, 255 - temperature));
			window.draw(circle);
		}
	}
	else
	{
		//Kółka sprowadzają się do punktów
		sf::Vertex point;
		int temperature;
		for(const auto& i : p)
		{
			temperature = i.getVelocity().getSquaredLength() * 1020.f; // * 255.f / 0.25f;
			temperature = temperature < 255 ? temperature : 255;
			point.position = {i.getPosition().getX() - radius, i.getPosition().getY() - radius};
			point.color = sf::Color(temperature, 0, 255 - temperature);
			window.draw(&point, 1, sf::Points);
		}
	}
	window.display();
}